

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O1

fstream * __thiscall
SharedDirectory::open_writable_file
          (fstream *__return_storage_ptr__,SharedDirectory *this,string *name)

{
  pointer pcVar1;
  iterator iVar2;
  Error *this_00;
  string local_60;
  path local_40;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find(&(this->pending_files)._M_t,name);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->pending_files)._M_t._M_impl.super__Rb_tree_header)
  {
    pcVar1 = (name->_M_dataplus)._M_p;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + name->_M_string_length);
    path_in_dir(&local_40,this,&local_60);
    boost::filesystem::basic_fstream<char,_std::char_traits<char>_>::basic_fstream
              (__return_storage_ptr__,&local_40,_S_out);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.m_pathname._M_dataplus._M_p != &local_40.m_pathname.field_2) {
      operator_delete(local_40.m_pathname._M_dataplus._M_p,
                      local_40.m_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(this_00,"File should be reserved first");
  __cxa_throw(this_00,&Error::typeinfo,std::exception::~exception);
}

Assistant:

boost::filesystem::fstream SharedDirectory::open_writable_file(const std::string &name) {
  if (pending_files.find(name) == pending_files.end()) {
    throw Error("File should be reserved first");
  }
  return fstream(path_in_dir(name), std::ios::out);
}